

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O3

void rtr_bgpsec_free_signatures(rtr_signature_seg *seg)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (seg == (rtr_signature_seg *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    if (seg->next != (rtr_signature_seg *)0x0) {
      rtr_bgpsec_free_signatures(seg->next);
    }
    lrtr_free(seg->signature);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      lrtr_free(seg);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void rtr_bgpsec_free_signatures(struct rtr_signature_seg *seg)
{
	if (!seg)
		return;
	if (seg->next)
		rtr_bgpsec_free_signatures(seg->next);
	lrtr_free(seg->signature);
	lrtr_free(seg);
}